

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall eprosima::fastcdr::Cdr::deserialize(Cdr *this,char *char_t)

{
  char *pcVar1;
  NotEnoughMemoryException *this_00;
  
  pcVar1 = (this->m_currentPosition).m_currentPosition;
  if ((this->m_lastPosition).m_currentPosition != pcVar1) {
    this->m_lastDataSize = 1;
    (this->m_currentPosition).m_currentPosition = pcVar1 + 1;
    *char_t = *pcVar1;
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr::DDSCdrPlFlag Cdr::getDDSCdrPlFlag() const
{
    return m_plFlag;
}